

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

Domain * __thiscall Scine::Core::Log::Domain::operator=(Domain *this,Domain *param_2)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
  *in_RSI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
  *in_RDI;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
  ::operator=(in_RSI,in_RDI);
  return (Domain *)in_RDI;
}

Assistant:

class CORE_EXPORT Domain {
   public:
    //! No-sink default constructor
    inline Domain() = default;
    //! Single-sink constructor
    inline Domain(std::string n, SinkPtr s) {
      sinks_.emplace(std::move(n), std::move(s));
    }

    //! Add a sink
    inline void add(std::string n, SinkPtr s) {
      sinks_.emplace(std::move(n), std::move(s));
    }

    //! Remove all sinks
    inline void clear() {
      sinks_.clear();
    }

    /*! @brief Remove a sink by name
     *
     * @throws std::out_of_range If no sink of that name exists in the Domain
     */
    inline void remove(const std::string& name) {
      sinks_.erase(expectantFind(name));
    }

    /*! @brief Extracts a sink by name
     *
     * Removes the link from the underlying map and returns it
     *
     * @throws std::out_of_range If no sink of that name exists in the Domain
     */
    inline SinkPtr extract(const std::string& name) {
      auto findIter = expectantFind(name);
      auto ptr = std::move(findIter->second);
      sinks_.erase(findIter);
      return ptr;
    }

    //! Returns whether this Domain has any sinks
    inline explicit operator bool() const {
      return !sinks_.empty();
    }

    /*! @brief Formatted logging analog to pfrintf.
     *
     * @code{.cpp}
     * domain.printf("Akerman #%3d", 3);
     * @endcode
     *
     * Variadic in nullary callables.
     */
    template<typename... Args>
    inline void printf(Args&&... args) {
      const int sz = snprintf(NULL, 0, std::forward<Args>(args)...);
      char* buf = new char[sz + 1];
      snprintf(buf, sz + 1, std::forward<Args>(args)...);
      (*this) << std::string(buf);
      delete[] buf;
    }

    /*! @brief Left-shifting with unary functions accepting ostream&
     *
     * @tparam T a callable accepting std::ostream&. Return type is unimportant.
     * Accepts lambdas and bind expressions.
     */
    template<typename T>
    std::enable_if_t<Traits::isStreamWriter<T>::value, Domain&> operator<<(T&& f) {
      for (auto& nameSinkPair : sinks_) {
        f(*nameSinkPair.second);
      }

      return *this;
    }

    /*! @brief Left-shifting with overload set
     *
     * You can left-shift this with anything on the right that is part of the
     * overload set of std::ostream& operator << (std::ostream& os, T&& t).
     */
    template<typename T>
    std::enable_if_t<!Traits::isStreamWriter<T>::value, Domain&> operator<<(T&& t) {
      for (auto& nameSinkPair : sinks_) {
        *nameSinkPair.second << t;
      }
      return *this;
    }

    /*! @brief Conditional logging with nullary callables
     *
     * If the composition of a log message can take significant time, it is
     * preferable to avoid composing it if the Domain has no sinks. This
     * function is sugar for the relevant pattern:
     *
     * @code{.cpp}
     * // Ackermann fn is executed even if domain has no sinks
     * domain << ackermann(4, 1);
     *
     * // Ackermann fn is executed only if domain has a sink
     * if(domain) {
     *   domain << ackermann(4, 1);
     * }
     *
     * // Sugar with nullary callables
     * domain.lazy(std::bind(ackermann, 4, 1));
     * @endcode
     *
     * Variadic in nullary callables.
     */
    template<typename... Args>
    inline void lazy(Args&&... args) {
      if (*this) {
        sink(std::forward<Args>(args)...);
      }
    }

    //! @brief Prints a single string with a newline character
    inline void line(const std::string& s) {
      if (*this) {
        *this << s << Log::nl;
      }
    }

   private:
    inline void sink() {
    }

    template<typename F, typename... Args>
    inline void sink(F&& f, Args&&... args) {
      *this << f();
      return sink(args...);
    }

    using MapType = std::unordered_map<std::string, SinkPtr>;
    using iterator = typename MapType::iterator;

    inline iterator expectantFind(const std::string& sinkName) {
      const auto findIter = sinks_.find(sinkName);
      if (findIter == std::end(sinks_)) {
        throw std::out_of_range("Sink name not found");
      }
      return findIter;
    }

    std::unordered_map<std::string, SinkPtr> sinks_;
  }